

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O1

pair<sjtu::trainType_*,_long> __thiscall
sjtu::DynamicFileManager<sjtu::trainType>::newspace(DynamicFileManager<sjtu::trainType> *this)

{
  fstream *pfVar1;
  undefined1 *puVar2;
  long lVar3;
  _Ios_Seekdir _Var4;
  pair<sjtu::trainType_*,_long> pVar5;
  locType offset_;
  locType offset;
  long local_a7d8;
  long local_a7d0;
  undefined1 local_a7c8 [42856];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  pfVar1 = &(this->super_FileManager_Base<sjtu::trainType>).file;
  local_40 = 0;
  uStack_38 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_60 = 0;
  uStack_58 = 0;
  std::istream::seekg((long)pfVar1,_S_beg);
  std::istream::read((char *)pfVar1,(long)&local_a7d0);
  puVar2 = &(this->super_FileManager_Base<sjtu::trainType>).field_0x18;
  std::ostream::seekp((long)puVar2,_S_beg);
  std::ios::clear((int)*(undefined8 *)
                        (*(long *)&(this->super_FileManager_Base<sjtu::trainType>).file + -0x18) +
                  (int)pfVar1);
  lVar3 = std::ostream::tellp();
  if (lVar3 == local_a7d0) {
    std::ostream::write(puVar2,(long)local_a7c8);
    local_a7d8 = local_a7d0 + 0xa7a8;
    std::ostream::seekp((long)puVar2,_S_beg);
    std::ostream::write(puVar2,(long)local_a7c8);
    _Var4 = 0xffff5858;
  }
  else {
    std::istream::seekg(pfVar1,local_a7d0,0);
    std::istream::read((char *)pfVar1,(long)&local_a7d8);
    _Var4 = _S_beg;
  }
  std::ostream::seekp((long)puVar2,_Var4);
  std::ostream::write(puVar2,(long)&local_a7d8);
  pVar5.first = LRUCache<sjtu::trainType>::load
                          ((this->super_FileManager_Base<sjtu::trainType>).cache,&local_a7d0);
  pVar5.second = local_a7d0;
  return pVar5;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			locType offset , offset_;T tmp;
			file.seekg(0 , std::ios_base::beg) , file.read(reinterpret_cast<char *> (&offset) , sizeof (locType));
			file.seekp(0 , std::ios_base::end) , file.clear();
			if (file.tellp() == offset)
			{
				file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				offset_ = offset + sizeof (T) , file.seekp(0 , std::ios_base::beg);
				file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				file.seekp(- sizeof (T) , std::ios_base::cur) , file.write(reinterpret_cast<char *> (&offset_) , sizeof (locType));
			}
			else
			{
				file.seekg(offset) , file.read(reinterpret_cast<char *> (&offset_) , sizeof (locType));
				//file.seekp(offset) , file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				file.seekp(0 , std::ios_base::beg) , file.write(reinterpret_cast<char *> (&offset_) , sizeof (locType));
			}
			return std::make_pair(cache -> load(offset) , offset);
		}